

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

void chaiscript::bootstrap::array<int[5],void>(string *type,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> local_d9;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b8;
  Type_Info local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,type);
  local_a8.m_type_info = (type_info *)&int_[5]::typeinfo;
  local_a8.m_bare_type_info = (type_info *)&int_[5]::typeinfo;
  local_a8.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,&local_a8,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int&(int(&)[5],unsigned_long),chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int(&)[5],unsigned_long)_1_>,chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int(&)[5],unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"[]",&local_d9);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b8,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int_const&(int_const(&)[5],unsigned_long),chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5],unsigned_long)_1_>,chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5],unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"[]",&local_d9);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(int_const(&)[5]),chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5])_1_>,chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5])_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"size",&local_d9);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void array(const std::string &type, Module &m) {
    using ReturnType = typename std::remove_extent<T>::type;

    m.add(user_type<T>(), type);
    m.add(fun([](T &t, size_t index) -> ReturnType & {
            constexpr const auto extent = std::extent<T>::value;
            if (extent > 0 && index >= extent) {
              throw std::range_error("Array index out of range. Received: " + std::to_string(index) + " expected < "
                                     + std::to_string(extent));
            } else {
              return t[index];
            }
          }),
          "[]");

    m.add(fun([](const T &t, size_t index) -> const ReturnType & {
            constexpr const auto extent = std::extent<T>::value;
            if (extent > 0 && index >= extent) {
              throw std::range_error("Array index out of range. Received: " + std::to_string(index) + " expected < "
                                     + std::to_string(extent));
            } else {
              return t[index];
            }
          }),
          "[]");

    m.add(fun([](const T &) { return std::extent<T>::value; }), "size");
  }